

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O2

void __thiscall
OpenMD::SwitchingFunction::setSwitch(SwitchingFunction *this,RealType rinner,RealType router)

{
  int iVar1;
  double dVar2;
  int iVar3;
  int i;
  int iVar4;
  double xp;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 local_48;
  
  if (router < rinner) {
    local_48 = SUB84(router,0);
    snprintf(painCave.errMsg,2000,
             "SwitchingFunction::setSwitch was given rinner (%lf) which was\n\tlarger than router (%lf).\n"
             ,rinner,local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if (router < 0.0) {
    snprintf(painCave.errMsg,2000,
             "SwitchingFunction::setSwitch was given router (%lf) which was\n\tless than zero.\n",
             router);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  if (rinner < 0.0) {
    snprintf(painCave.errMsg,2000,
             "SwitchingFunction::setSwitch was given rinner (%lf) which was\n\tless than zero.\n",
             router);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  this->rin_ = rinner;
  this->rout_ = router;
  this->rin2_ = rinner * rinner;
  this->rout2_ = router * router;
  if (1e-08 <= router - rinner) {
    if (this->functionType_ == fifth_order_poly) {
      this->isCubic_ = false;
      iVar3 = this->np_;
      iVar1 = iVar3 + -1;
      for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
        dVar6 = this->rin_;
        xp = (double)iVar4 * ((router - rinner) / (double)iVar1) + dVar6;
        dVar5 = xp - dVar6;
        dVar2 = dVar5 * dVar5;
        dVar6 = 1.0 / (this->rout_ - dVar6);
        dVar7 = dVar6 * dVar6;
        CubicSpline::addPoint
                  ((this->switchSpline_).
                   super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,xp,
                   dVar2 * dVar5 * dVar2 * -6.0 * dVar7 * dVar6 * dVar7 +
                   dVar2 * dVar2 * 15.0 * dVar7 * dVar7 +
                   dVar5 * dVar2 * -10.0 * dVar6 * dVar7 + 1.0);
        iVar3 = this->np_;
      }
    }
    else {
      this->isCubic_ = true;
      CubicSpline::addPoint
                ((this->switchSpline_).
                 super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,rinner,
                 1.0);
      CubicSpline::addPoint
                ((this->switchSpline_).
                 super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 this->rout_,0.0);
    }
    this->haveSpline_ = true;
  }
  return;
}

Assistant:

void SwitchingFunction::setSwitch(RealType rinner, RealType router) {
    if (router < rinner) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SwitchingFunction::setSwitch was given rinner (%lf) which was\n"
               "\tlarger than router (%lf).\n",
               rinner, router);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    if (router < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SwitchingFunction::setSwitch was given router (%lf) which was\n"
               "\tless than zero.\n",
               router);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    if (rinner < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SwitchingFunction::setSwitch was given rinner (%lf) which was\n"
               "\tless than zero.\n",
               router);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    rin_   = rinner;
    rout_  = router;
    rin2_  = rin_ * rin_;
    rout2_ = rout_ * rout_;

    if ((router - rinner) < 1.0e-8) {
      // no reason to set up spline if the switching region is tiny
      return;
    }

    // setup r -> sw lookup spline
    if (functionType_ == fifth_order_poly) {
      isCubic_    = false;
      RealType c0 = 1.0;
      RealType c3 = -10.0;
      RealType c4 = 15.0;
      RealType c5 = -6.0;

      RealType dx, r, yval, rval, rval2, rval3, rval4, rval5;
      RealType rvaldi, rvaldi2, rvaldi3, rvaldi4, rvaldi5;

      dx = (rout_ - rin_) / RealType(np_ - 1);

      for (int i = 0; i < np_; i++) {
        r       = rin_ + RealType(i) * dx;
        rval    = (r - rin_);
        rval2   = rval * rval;
        rval3   = rval2 * rval;
        rval4   = rval2 * rval2;
        rval5   = rval3 * rval2;
        rvaldi  = 1.0 / (rout_ - rin_);
        rvaldi2 = rvaldi * rvaldi;
        rvaldi3 = rvaldi2 * rvaldi;
        rvaldi4 = rvaldi2 * rvaldi2;
        rvaldi5 = rvaldi3 * rvaldi2;
        yval    = c0 + c3 * rval3 * rvaldi3 + c4 * rval4 * rvaldi4 +
               c5 * rval5 * rvaldi5;
        switchSpline_->addPoint(r, yval);
      }
    } else {
      // cubic splines only need 2 points to do a cubic switching function...
      isCubic_ = true;
      switchSpline_->addPoint(rin_, 1.0);
      switchSpline_->addPoint(rout_, 0.0);
    }
    haveSpline_ = true;
    return;
  }